

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Descriptor * __thiscall google::protobuf::FieldDescriptor::message_type(FieldDescriptor *this)

{
  Descriptor *local_28;
  FieldDescriptor *local_18;
  FieldDescriptor *local_10;
  FieldDescriptor *this_local;
  
  if (*(long *)(this + 0x18) != 0) {
    local_18 = this;
    local_10 = this;
    internal::
    call_once<std::once_flag&,void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),TypeOnceInit,&local_18);
  }
  if ((this[2] == (FieldDescriptor)0xb) || (this[2] == (FieldDescriptor)0xa)) {
    local_28 = *(Descriptor **)(this + 0x30);
  }
  else {
    local_28 = (Descriptor *)0x0;
  }
  return local_28;
}

Assistant:

const Descriptor* FieldDescriptor::message_type() const {
  if (type_once_) {
    internal::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
  }
  return type_ == TYPE_MESSAGE || type_ == TYPE_GROUP
             ? type_descriptor_.message_type
             : nullptr;
}